

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_deviate_units(ly_ctx *ctx,lys_deviate *deviate,lys_node *dev_target)

{
  lys_node *plVar1;
  int local_34;
  lys_node **pplStack_30;
  int j;
  char **stritem;
  lys_node *dev_target_local;
  lys_deviate *deviate_local;
  ly_ctx *ctx_local;
  
  if ((dev_target->nodetype != LYS_LEAFLIST) && (dev_target->nodetype != LYS_LEAF)) {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"units");
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"units\" property.");
    return 1;
  }
  pplStack_30 = &dev_target[1].next;
  if (deviate->mod == LY_DEVIATE_DEL) {
    if (*pplStack_30 != (lys_node *)deviate->units) {
      ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,deviate->units,"units");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Value differs from the target being deleted.");
      return 1;
    }
    lydict_remove(ctx,(char *)*pplStack_30);
    *pplStack_30 = (lys_node *)0x0;
    local_34 = -1;
    while (local_34 = lys_ext_iter(dev_target->ext,dev_target->ext_size,(char)local_34 + '\x01',
                                   LYEXT_SUBSTMT_UNITS), local_34 != -1) {
      lyp_ext_instance_rm(ctx,&dev_target->ext,&dev_target->ext_size,(uint8_t)local_34);
      local_34 = local_34 + -1;
    }
  }
  else {
    if (deviate->mod == LY_DEVIATE_ADD) {
      if (*pplStack_30 != (lys_node *)0x0) {
        ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"units");
        ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Adding property that already exists.");
        return 1;
      }
    }
    else if (*pplStack_30 == (lys_node *)0x0) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"units");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Replacing a property that does not exist.");
      return 1;
    }
    lydict_remove(ctx,(char *)*pplStack_30);
    plVar1 = (lys_node *)lydict_insert(ctx,deviate->units,0);
    *pplStack_30 = plVar1;
  }
  return 0;
}

Assistant:

int
yang_read_deviate_units(struct ly_ctx *ctx, struct lys_deviate *deviate, struct lys_node *dev_target)
{
    const char **stritem;
    int j;

    /* check target node type */
    if (dev_target->nodetype == LYS_LEAFLIST) {
        stritem = &((struct lys_node_leaflist *)dev_target)->units;
    } else if (dev_target->nodetype == LYS_LEAF) {
        stritem = &((struct lys_node_leaf *)dev_target)->units;
    } else {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "units");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"units\" property.");
        goto error;
    }

    if (deviate->mod == LY_DEVIATE_DEL) {
        /* check values */
        if (!ly_strequal(*stritem, deviate->units, 1)) {
            LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, deviate->units, "units");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
            goto error;
        }
        /* remove current units value of the target */
        lydict_remove(ctx, *stritem);
        *stritem = NULL;
        /* remove its extensions */
        j = -1;
        while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_UNITS)) != -1) {
            lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
            --j;
        }
    } else {
        if (deviate->mod == LY_DEVIATE_ADD) {
            /* check that there is no current value */
            if (*stritem) {
                LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "units");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
                goto error;
            }
        } else { /* replace */
            if (!*stritem) {
                LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "units");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Replacing a property that does not exist.");
                goto error;
            }
        }
        /* remove current units value of the target ... */
        lydict_remove(ctx, *stritem);

        /* ... and replace it with the value specified in deviation */
        *stritem = lydict_insert(ctx, deviate->units, 0);
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}